

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback_hang_test.c
# Opt level: O3

void callback_hang_test(int converter)

{
  undefined8 in_RAX;
  char *pcVar1;
  SRC_STATE *state;
  long lVar2;
  int error;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  pcVar1 = src_get_name(converter);
  printf("\tcallback_hang_test  (%-28s) ....... ",pcVar1);
  fflush(_stdout);
  state = src_callback_new(input_callback,converter,1,&local_24,(void *)0x0);
  if (state != (SRC_STATE *)0x0) {
    lVar2 = 8;
    do {
      alarm(1);
      src_callback_read(state,*(double *)(&UNK_00106008 + lVar2),
                        (long)*(int *)((long)&callback_hang_test::pairs[0].ratio + lVar2),
                        callback_hang_test::output);
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x98);
    src_delete(state);
    alarm(0);
    puts("ok");
    return;
  }
  pcVar1 = src_strerror(local_24);
  printf("\n\nLine %d : src_callback_new () failed : %s\n\n",0x51,pcVar1);
  exit(1);
}

Assistant:

static void
callback_hang_test (int converter)
{	static float output [LONG_BUFFER_LEN] ;
	static SRC_PAIR pairs [] =
	{
		{ 1.2, 5 }, { 1.1, 1 }, { 1.0, 1 }, { 3.0, 1 }, { 2.0, 1 }, { 0.3, 1 },
		{ 1.2, 0 }, { 1.1, 10 }, { 1.0, 1 }
		} ;


	SRC_STATE	*src_state ;

	double src_ratio = 1.0 ;
	int k, error ;

	printf ("\tcallback_hang_test  (%-28s) ....... ", src_get_name (converter)) ;
	fflush (stdout) ;

	/* Perform sample rate conversion. */
	src_state = src_callback_new (input_callback, converter, 1, &error, NULL) ;
	if (src_state == NULL)
	{	printf ("\n\nLine %d : src_callback_new () failed : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	for (k = 0 ; k < ARRAY_LEN (pairs) ; k++)
	{	alarm (1) ;
		src_ratio = pairs [k].ratio ;
		src_callback_read (src_state, src_ratio, pairs [k].count, output) ;
		} ;

	src_state = src_delete (src_state) ;

	alarm (0) ;
	puts ("ok") ;

	return ;
}